

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O1

void __thiscall GOESNImageHandler::overlayMaps(GOESNImageHandler *this,File *f,Area *crop,Mat *mat)

{
  return;
}

Assistant:

void GOESNImageHandler::overlayMaps(
    const lrit::File& f,
    const Area& crop,
    cv::Mat& mat) {
#ifdef HAS_PROJ
  if (config_.maps.empty()) {
    return;
  }

  auto inh = f.getHeader<lrit::ImageNavigationHeader>();
  auto lon = inh.getLongitude();

  // GOES-16 doing relay of GOES-15 reports -135.5 but is actually at -135.0
  if (fabsf(lon - (-135.5)) < 1e-3) {
    lon = -135.0;
  }

  // GOES-15 drift completed on November 7, 2018 at 1900 UTC.
  // GOES-16 and GOES-17 are reporting its previous location
  // in the headers of the relayed LRITs.
  auto ts = f.getHeader<lrit::TimeStampHeader>().getUnix();
  if ((fabsf(lon - (-135.0)) < 1e-3) && ts.tv_sec >= 1541617200) {
    lon = -128.0;
  }

  // If a crop was used, the column and line offsets need to be fixed.
  if (!crop.empty()) {
    inh.columnOffset -= (crop.minColumn - -((int32_t) inh.columnOffset));
    inh.lineOffset -= (crop.minLine - -(int32_t) inh.lineOffset);
  }

  // The image already has the aspect ratio fixed; do it here as well.
  inh.lineOffset *= ((float) inh.columnScaling / (float) inh.lineScaling);
  inh.lineScaling = inh.columnScaling;

  // Smudge factor to make it visually match up better
  inh.columnScaling *= 1.001;
  inh.lineScaling *= 1.001;

  // TODO: The map drawer should be cached by construction parameters.
  auto drawer = MapDrawer(&config_, lon, inh);
  mat = drawer.draw(mat);
#endif
}